

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.hpp
# Opt level: O2

void __thiscall gfx::Program::check_validation(Program *this,GLuint shader)

{
  runtime_error *this_00;
  GLint max_length;
  GLint is_ok;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string err;
  vector<char,_std::allocator<char>_> info_log;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  is_ok = 0;
  (*glad_glGetProgramiv)(this->id,0x8b83,&is_ok);
  if (is_ok != 0) {
    return;
  }
  max_length = 0;
  (*glad_glGetProgramiv)(this->id,0x8b84,&max_length);
  std::vector<char,_std::allocator<char>_>::vector
            (&info_log,(long)max_length,(allocator_type *)&err);
  (*glad_glGetProgramInfoLog)
            (this->id,max_length,(GLsizei *)0x0,
             info_log.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"GLSL validation error for program: ",(allocator<char> *)&local_b8);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_60,&err,&this->name);
  std::operator+(&local_40,&local_60,"\n");
  std::operator+(&local_b8,&local_40,
                 info_log.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
  std::runtime_error::runtime_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_validation(GLuint shader) {
        GLint is_ok = 0;
        glGetProgramiv(id, GL_VALIDATE_STATUS, &is_ok);
        if (!is_ok) {
			GLint max_length = 0;
            glGetProgramiv(id, GL_INFO_LOG_LENGTH, &max_length);

            // The maxLength includes the NULL character
            std::vector<GLchar> info_log(max_length);
            glGetProgramInfoLog(id, max_length, NULL, &info_log[0]);

            const std::string err = "GLSL validation error for program: ";
            throw std::runtime_error(err + name + "\n" + info_log.data());
		}
    }